

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsExecuter.h
# Opt level: O0

void __thiscall Refal2::COperationsExecuter::matchRightBegin_E(COperationsExecuter *this)

{
  COperationsExecuter *this_local;
  
  nextOperation(this);
  saveState(this);
  nextOperation(this);
  return;
}

Assistant:

inline void COperationsExecuter::matchRightBegin_E()
{
	nextOperation();
	saveState();
	nextOperation();
}